

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_remove(void **param_1)

{
  uint64_t i_3;
  uint64_t i_2;
  uint64_t i_1;
  uint64_t i;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000050;
  int in_stack_ffffffffffffffcc;
  roaring64_bitmap_t *in_stack_ffffffffffffffd0;
  char *file;
  roaring64_bitmap_t *in_stack_ffffffffffffffd8;
  roaring64_bitmap_t *r_00;
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  roaring64_bitmap_t *r_01;
  ulong local_18;
  
  roaring64_bitmap_create();
  for (local_18 = 0; local_18 < 100; local_18 = local_18 + 1) {
    roaring64_bitmap_add(in_stack_ffffffffffffffe0,(uint64_t)in_stack_ffffffffffffffd8);
  }
  for (r_01 = (roaring64_bitmap_t *)0x0; r_01 < (roaring64_bitmap_t *)0x64;
      r_01 = (roaring64_bitmap_t *)((long)&(r_01->art).root + 1)) {
    roaring64_bitmap_contains(in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0);
    _assert_true((unsigned_long)r_01,(char *)in_stack_ffffffffffffffd8,
                 (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  for (r_00 = (roaring64_bitmap_t *)0x0; r_00 < (roaring64_bitmap_t *)0x64;
      r_00 = (roaring64_bitmap_t *)((long)&(r_00->art).root + 1)) {
    roaring64_bitmap_remove(r_01,(uint64_t)r_00);
    assert_r64_valid(in_stack_ffffffffffffffd0);
  }
  for (file = (char *)0x0; file < (char *)0x64; file = file + 1) {
    roaring64_bitmap_contains(r_00,(uint64_t)file);
    _assert_true((unsigned_long)r_01,(char *)r_00,file,in_stack_ffffffffffffffcc);
  }
  roaring64_bitmap_free(in_stack_00000050);
  return;
}

Assistant:

DEFINE_TEST(test_remove) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 10000);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        assert_true(roaring64_bitmap_contains(r, i * 10000));
    }
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_remove(r, i * 10000);
        assert_r64_valid(r);
    }
    for (uint64_t i = 0; i < 100; ++i) {
        assert_false(roaring64_bitmap_contains(r, i * 10000));
    }
    roaring64_bitmap_free(r);
}